

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O1

void __thiscall
cbtPairCachingGhostObject::removeOverlappingObjectInternal
          (cbtPairCachingGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtDispatcher *dispatcher,
          cbtBroadphaseProxy *thisProxy1)

{
  uint uVar1;
  cbtCollisionObject **ppcVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar3;
  
  if (thisProxy1 == (cbtBroadphaseProxy *)0x0) {
    thisProxy1 = (this->super_cbtGhostObject).super_cbtCollisionObject.m_broadphaseHandle;
  }
  uVar1 = (this->super_cbtGhostObject).m_overlappingObjects.m_size;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      if ((this->super_cbtGhostObject).m_overlappingObjects.m_data[uVar3] ==
          (cbtCollisionObject *)otherProxy->m_clientObject) goto LAB_008eaf78;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  uVar3 = (ulong)uVar1;
LAB_008eaf78:
  if ((int)uVar3 < (int)uVar1) {
    ppcVar2 = (this->super_cbtGhostObject).m_overlappingObjects.m_data;
    ppcVar2[(int)uVar3] = ppcVar2[(long)(int)uVar1 + -1];
    (this->super_cbtGhostObject).m_overlappingObjects.m_size = uVar1 - 1;
    UNRECOVERED_JUMPTABLE =
         (this->m_hashPairCache->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
         _vptr_cbtOverlappingPairCallback[3];
    (*UNRECOVERED_JUMPTABLE)
              (this->m_hashPairCache,thisProxy1,otherProxy,dispatcher,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void cbtPairCachingGhostObject::removeOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtDispatcher* dispatcher, cbtBroadphaseProxy* thisProxy1)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtBroadphaseProxy* actualThisProxy = thisProxy1 ? thisProxy1 : getBroadphaseHandle();
	cbtAssert(actualThisProxy);

	cbtAssert(otherObject);
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index < m_overlappingObjects.size())
	{
		m_overlappingObjects[index] = m_overlappingObjects[m_overlappingObjects.size() - 1];
		m_overlappingObjects.pop_back();
		m_hashPairCache->removeOverlappingPair(actualThisProxy, otherProxy, dispatcher);
	}
}